

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_c_linkage(CompilerCPP *this)

{
  byte bVar1;
  bool bVar2;
  allocator local_31;
  string local_30 [32];
  CompilerCPP *local_10;
  CompilerCPP *this_local;
  
  local_10 = this;
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  CompilerGLSL::statement<char_const(&)[50]>
            (&this->super_CompilerGLSL,
             (char (*) [50])"spirv_cross_shader_t *spirv_cross_construct(void)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [12])"return new ",&this->impl_type,
             (char (*) [4])0x40acac);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  CompilerGLSL::statement<char_const(&)[56]>
            (&this->super_CompilerGLSL,
             (char (*) [56])"void spirv_cross_destruct(spirv_cross_shader_t *shader)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[20],std::__cxx11::string&,char_const(&)[12]>
            (&this->super_CompilerGLSL,(char (*) [20])"delete static_cast<",&this->impl_type,
             (char (*) [12])"*>(shader);");
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  CompilerGLSL::statement<char_const(&)[54]>
            (&this->super_CompilerGLSL,
             (char (*) [54])"void spirv_cross_invoke(spirv_cross_shader_t *shader)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[22]>
            (&this->super_CompilerGLSL,(char (*) [13])0x4126df,&this->impl_type,
             (char (*) [22])"*>(shader)->invoke();");
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  CompilerGLSL::statement<char_const(&)[51]>
            (&this->super_CompilerGLSL,
             (char (*) [51])"static const struct spirv_cross_interface vtable =");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[23]>
            (&this->super_CompilerGLSL,(char (*) [23])"spirv_cross_construct,");
  CompilerGLSL::statement<char_const(&)[22]>
            (&this->super_CompilerGLSL,(char (*) [22])"spirv_cross_destruct,");
  CompilerGLSL::statement<char_const(&)[20]>
            (&this->super_CompilerGLSL,(char (*) [20])"spirv_cross_invoke,");
  CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
  bVar1 = ::std::__cxx11::string::empty();
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"spirv_cross_get_interface",&local_31);
  }
  else {
    ::std::__cxx11::string::string(local_30,(string *)&this->interface_name);
  }
  CompilerGLSL::statement<char_const(&)[37],std::__cxx11::string,char_const(&)[7]>
            (&this->super_CompilerGLSL,(char (*) [37])"const struct spirv_cross_interface *",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [7])0x41268d);
  ::std::__cxx11::string::~string(local_30);
  if (bVar2) {
    ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[16]>
            (&this->super_CompilerGLSL,(char (*) [16])"return &vtable;");
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerCPP::emit_c_linkage()
{
	statement("");

	statement("spirv_cross_shader_t *spirv_cross_construct(void)");
	begin_scope();
	statement("return new ", impl_type, "();");
	end_scope();

	statement("");
	statement("void spirv_cross_destruct(spirv_cross_shader_t *shader)");
	begin_scope();
	statement("delete static_cast<", impl_type, "*>(shader);");
	end_scope();

	statement("");
	statement("void spirv_cross_invoke(spirv_cross_shader_t *shader)");
	begin_scope();
	statement("static_cast<", impl_type, "*>(shader)->invoke();");
	end_scope();

	statement("");
	statement("static const struct spirv_cross_interface vtable =");
	begin_scope();
	statement("spirv_cross_construct,");
	statement("spirv_cross_destruct,");
	statement("spirv_cross_invoke,");
	end_scope_decl();

	statement("");
	statement("const struct spirv_cross_interface *",
	          interface_name.empty() ? string("spirv_cross_get_interface") : interface_name, "(void)");
	begin_scope();
	statement("return &vtable;");
	end_scope();
}